

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_TakeStep_Z(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  ARKodeMem pAVar1;
  realtype *prVar2;
  N_Vector *pp_Var3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  N_Vector p_Var7;
  byte bVar8;
  double dVar9;
  int nvec;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int local_6c;
  ARKodeMem local_68;
  uint local_5c;
  realtype *local_58;
  N_Vector *local_50;
  realtype *local_48;
  int *local_40;
  ARKodeARKStepMem local_38;
  
  iVar4 = arkStep_AccessStepMem(arkode_mem,"arkStep_TakeStep_Z",&local_68,&local_38);
  pAVar1 = local_68;
  if (iVar4 != 0) {
    return iVar4;
  }
  local_48 = local_38->cvals;
  local_50 = local_38->Xvecs;
  if ((local_38->implicit == 0) && (local_38->mass_type == 0)) {
    *nflagPtr = 0;
  }
  if ((local_38->NLS != (SUNNonlinearSolver)0x0) &&
     (local_38->NLS->ops->setup != (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0)) {
    p_Var7 = local_68->tempv3;
    N_VConst(0.0,p_Var7);
    iVar4 = SUNNonlinSolSetup(local_38->NLS,p_Var7,pAVar1);
    if (iVar4 < 0) {
      return -0x1e;
    }
    if (iVar4 != 0) {
      return -0x1f;
    }
  }
  pAVar1 = local_68;
  local_58 = dsmPtr;
  if (0 < local_38->stages) {
    uVar6 = 0;
    local_40 = nflagPtr;
    do {
      local_38->istage = (int)uVar6;
      pAVar1->tcur = (&local_38->Be)[local_38->implicit != 0]->c[uVar6] * pAVar1->h + pAVar1->tn;
      if (((local_38->mass_type == 2) && (local_38->msetup != (ARKMassSetupFn)0x0)) &&
         (iVar4 = (*local_38->msetup)(pAVar1,pAVar1->tcur,pAVar1->tempv1,pAVar1->tempv2,
                                      pAVar1->tempv3), iVar4 != 0)) {
        return -0xf;
      }
      if (local_38->implicit == 0) {
        bVar8 = 0;
        iVar4 = 0;
      }
      else {
        bVar8 = 0;
        iVar4 = 0;
        if (1e-10 < ABS(local_38->Bi->A[uVar6][uVar6])) {
          iVar4 = 1;
          bVar8 = 1;
        }
      }
      if (bVar8 != 0) {
        iVar5 = arkStep_Predict(pAVar1,(int)uVar6,local_38->zpred);
        if (iVar5 != 0) {
          return iVar5;
        }
        if (local_38->stage_predict != (ARKStagePredictFn)0x0) {
          iVar5 = (*local_38->stage_predict)(pAVar1->tcur,local_38->zpred,pAVar1->user_data);
          if (iVar5 < 0) {
            return -0x27;
          }
          if (iVar5 != 0) goto LAB_004dce3f;
        }
      }
      iVar4 = arkStep_StageSetup(pAVar1,iVar4);
      if (iVar4 != 0) {
        return iVar4;
      }
      if (pAVar1->report != 0) {
        fprintf((FILE *)pAVar1->diagfp,"ARKStep  step  %li  %.16g  %i  %.16g\n",pAVar1->h,
                pAVar1->tcur,pAVar1->nst,uVar6 & 0xffffffff);
      }
      nflagPtr = local_40;
      if (bVar8 == 0) {
        if (local_38->mass_type == 1) {
          iVar4 = (*local_38->msolve)(pAVar1,local_38->sdata,local_38->nlscoef);
          *nflagPtr = iVar4;
          if (iVar4 != 0) goto LAB_004dce3f;
        }
        N_VLinearSum(1.0,pAVar1->yn,1.0,local_38->sdata,pAVar1->ycur);
      }
      else {
        iVar4 = arkStep_Nls(pAVar1,*local_40);
        *nflagPtr = iVar4;
        if (iVar4 != 0) goto LAB_004dce3f;
      }
      if ((pAVar1->ProcessStage != (ARKPostProcessFn)0x0) &&
         (iVar4 = (*pAVar1->ProcessStage)(pAVar1->tcur,pAVar1->ycur,pAVar1->user_data), iVar4 != 0))
      {
        return -0x26;
      }
      if (local_38->implicit != 0) {
        bVar8 = bVar8 & local_38->deduce_rhs != 0;
        if (bVar8 == 0) {
          iVar4 = (*local_38->fi)(pAVar1->tcur,pAVar1->ycur,local_38->Fi[uVar6],pAVar1->user_data);
          local_38->nfi = local_38->nfi + 1;
        }
        else {
          if (local_38->mass_type == 1) {
            iVar4 = (*local_38->mmult)(pAVar1,local_38->zcor,pAVar1->tempv1);
            if (iVar4 != 0) {
              return -0x12;
            }
            dVar9 = local_38->gamma;
            p_Var7 = pAVar1->tempv1;
          }
          else {
            dVar9 = local_38->gamma;
            p_Var7 = local_38->zcor;
          }
          N_VLinearSum(1.0 / dVar9,p_Var7,-1.0 / dVar9,local_38->sdata,local_38->Fi[uVar6]);
          iVar4 = 0;
        }
        prVar2 = local_48;
        pp_Var3 = local_50;
        if (iVar4 < 0) {
          return -8;
        }
        if (iVar4 != 0) {
          return -0xb;
        }
        local_5c = (uint)bVar8;
        if (local_38->impforcing != 0) {
          *local_48 = 1.0;
          *local_50 = local_38->Fi[uVar6];
          local_6c = 1;
          arkStep_ApplyForcing(local_38,pAVar1->tcur,1.0,&local_6c);
          N_VLinearCombination(local_6c,prVar2,pp_Var3,local_38->Fi[uVar6]);
        }
      }
      if (local_38->explicit != 0) {
        iVar4 = (*local_38->fe)(local_38->Be->c[uVar6] * pAVar1->h + pAVar1->tn,pAVar1->ycur,
                                local_38->Fe[uVar6],pAVar1->user_data);
        prVar2 = local_48;
        pp_Var3 = local_50;
        local_38->nfe = local_38->nfe + 1;
        if (iVar4 < 0) {
          return -8;
        }
        if (iVar4 != 0) {
          return -0xb;
        }
        if (local_38->expforcing != 0) {
          *local_48 = 1.0;
          *local_50 = local_38->Fe[uVar6];
          local_6c = 1;
          arkStep_ApplyForcing
                    (local_38,local_38->Be->c[uVar6] * pAVar1->h + pAVar1->tn,1.0,&local_6c);
          N_VLinearCombination(local_6c,prVar2,pp_Var3,local_38->Fe[uVar6]);
        }
      }
      if (local_38->mass_type == 2) {
        if ((local_38->implicit != 0) && (local_5c == 0)) {
          iVar4 = (*local_38->msolve)(pAVar1,local_38->Fi[uVar6],local_38->nlscoef);
          *nflagPtr = iVar4;
          if (iVar4 != 0) goto LAB_004dce3f;
        }
        if (local_38->explicit != 0) {
          iVar4 = (*local_38->msolve)(pAVar1,local_38->Fe[uVar6],local_38->nlscoef);
          *nflagPtr = iVar4;
          if (iVar4 != 0) goto LAB_004dce3f;
        }
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)local_38->stages);
  }
  prVar2 = local_58;
  if (local_38->mass_type == 1) {
    iVar4 = arkStep_ComputeSolutions_MassFixed(local_68,local_58);
  }
  else {
    iVar4 = arkStep_ComputeSolutions(local_68,local_58);
  }
  if (-1 < iVar4) {
    if (iVar4 == 0) {
      iVar4 = 0;
      if (local_68->report != 0) {
        fprintf((FILE *)local_68->diagfp,"ARKStep  etest  %li  %.16g  %.16g\n",local_68->h,*prVar2,
                local_68->nst);
        iVar4 = 0;
      }
    }
    else {
      *nflagPtr = iVar4;
LAB_004dce3f:
      iVar4 = 5;
    }
  }
  return iVar4;
}

Assistant:

int arkStep_TakeStep_Z(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  int retval, is, nvec;
  booleantype implicit_stage;
  booleantype deduce_stage;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  N_Vector zcor0;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_TakeStep_Z",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* if problem will involve no algebraic solvers, initialize nflagPtr to success */
  if ((!step_mem->implicit) && (step_mem->mass_type == MASS_IDENTITY))
    *nflagPtr = ARK_SUCCESS;

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
    if ((step_mem->NLS)->ops->setup) {
      zcor0 = ark_mem->tempv3;
      N_VConst(ZERO, zcor0);    /* set guess to all 0 (since using predictor-corrector form) */
      retval = SUNNonlinSolSetup(step_mem->NLS, zcor0, ark_mem);
      if (retval < 0) return(ARK_NLS_SETUP_FAIL);
      if (retval > 0) return(ARK_NLS_SETUP_RECVR);
    }

  /* loop over internal stages to the step */
  for (is=0; is<step_mem->stages; is++) {

    /* store current stage index */
    step_mem->istage = is;

    /* set current stage time(s) */
    if (step_mem->implicit)
      ark_mem->tcur = ark_mem->tn + step_mem->Bi->c[is]*ark_mem->h;
    else
      ark_mem->tcur = ark_mem->tn + step_mem->Be->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ARKStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* setup time-dependent mass matrix */
    if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL)) {
      retval = step_mem->msetup((void *) ark_mem, ark_mem->tcur,
                                ark_mem->tempv1, ark_mem->tempv2,
                                ark_mem->tempv3);
      if (retval != ARK_SUCCESS)  return(ARK_MASSSETUP_FAIL);
    }

    /* determine whether implicit solve is required */
    implicit_stage = SUNFALSE;
    if (step_mem->implicit)
      if (SUNRabs(step_mem->Bi->A[is][is]) > TINY)
        implicit_stage = SUNTRUE;

#ifdef SUNDIALS_DEBUG
    if (implicit_stage)
      printf("implicit stage\n");
    else
      printf("explicit stage\n");
#endif

    /* if implicit, call built-in and user-supplied predictors
       (results placed in zpred) */
    if (implicit_stage) {

      retval = arkStep_Predict(ark_mem, is, step_mem->zpred);
      if (retval != ARK_SUCCESS)  return (retval);

      /* if a user-supplied predictor routine is provided, call that here.
         Note that arkStep_Predict is *still* called, so this user-supplied
         routine can just 'clean up' the built-in prediction, if desired. */
      if (step_mem->stage_predict) {
        retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                         ark_mem->user_data);
        if (retval < 0)  return(ARK_USER_PREDICT_FAIL);
        if (retval > 0)  return(TRY_AGAIN);
      }

    }

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep predictor:\n");
    N_VPrint(step_mem->zpred);
#endif

    /* set up explicit data for evaluation of ARK stage (store in sdata) */
    retval = arkStep_StageSetup(ark_mem, implicit_stage);
    if (retval != ARK_SUCCESS)  return (retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep rhs data:\n");
    N_VPrint(step_mem->sdata);
#endif

    /* solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "ARKStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::arkStep_TakeStep_Z", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* perform implicit solve if required */
    if (implicit_stage) {

      /* implicit solve result is stored in ark_mem->ycur;
         return with positive value on anything but success */
      *nflagPtr = arkStep_Nls(ark_mem, *nflagPtr);
      if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep implicit stage %i solution:\n",is);
      N_VPrint(ark_mem->ycur);
#endif

    /* otherwise no implicit solve is needed */
    } else {

      /* if M is fixed, solve with it to compute update (place back in sdata) */
      if (step_mem->mass_type == MASS_FIXED) {

        /* perform solve; return with positive value on anything but success */
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->sdata,
                                     step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

      }

      /* set y to be yn + sdata (either computed in arkStep_StageSetup,
         or updated in prev. block) */
      N_VLinearSum(ONE, ark_mem->yn, ONE, step_mem->sdata, ark_mem->ycur);

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep explicit stage %i solution:\n",is);
      N_VPrint(ark_mem->ycur);
#endif

    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    /* NOTE: with internally inconsistent IMEX methods (c_i^E != c_i^I) the value
       of tcur corresponds to the stage time from the implicit table (c_i^I). */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* successful stage solve */
    /*    store implicit RHS (value in Fi[is] is from preceding nonlinear iteration) */
    if (step_mem->implicit) {
      deduce_stage = step_mem->deduce_rhs && implicit_stage;

      if (!deduce_stage) {
        retval = step_mem->fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[is], ark_mem->user_data);
        step_mem->nfi++;
      } else if (step_mem->mass_type == MASS_FIXED)  {
        retval = step_mem->mmult((void *) ark_mem, step_mem->zcor, ark_mem->tempv1);
        if (retval != ARK_SUCCESS)  return (ARK_MASSMULT_FAIL);
        N_VLinearSum(ONE / step_mem->gamma, ark_mem->tempv1,
                     -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
      } else {
        N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                     -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
      }

#ifdef SUNDIALS_DEBUG_PRINTVEC
      printf("    ARKStep implicit stage RHS Fi[%i]:\n",is);
      N_VPrint(step_mem->Fi[is]);
#endif

      if (retval < 0)  return(ARK_RHSFUNC_FAIL);
      if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);
      /* apply external polynomial forcing */
      if (step_mem->impforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->Fi[is];
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fi[is]);
      }
    }

    /*    store explicit RHS */
    if (step_mem->explicit) {
        retval = step_mem->fe(ark_mem->tn + step_mem->Be->c[is]*ark_mem->h,
                              ark_mem->ycur, step_mem->Fe[is], ark_mem->user_data);
        step_mem->nfe++;

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    ARKStep explicit stage RHS Fe[%i]:\n",is);
        N_VPrint(step_mem->Fe[is]);
#endif

        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);
        /* apply external polynomial forcing */
        if (step_mem->expforcing) {
          cvals[0] = ONE;
          Xvecs[0] = step_mem->Fe[is];
          nvec     = 1;
          arkStep_ApplyForcing(step_mem, ark_mem->tn+step_mem->Be->c[is]*ark_mem->h,
                               ONE, &nvec);
          N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fe[is]);
        }
    }

    /* if using a time-dependent mass matrix, update Fe[is] and/or Fi[is] with M(t)^{-1} */
    if (step_mem->mass_type == MASS_TIMEDEP) {
      /* If the implicit stage was deduced, it already includes M(t)^{-1} */
      if (step_mem->implicit && !deduce_stage) {
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->Fi[is], step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);
      }
      if (step_mem->explicit) {
        *nflagPtr = step_mem->msolve((void *) ark_mem, step_mem->Fe[is], step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);
      }
    }

  } /* loop over stages */

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm).
     This can fail recoverably due to nonconvergence of the mass matrix solve,
     so handle that appropriately. */
  if (step_mem->mass_type == MASS_FIXED) {
    retval = arkStep_ComputeSolutions_MassFixed(ark_mem, dsmPtr);
  } else {
    retval = arkStep_ComputeSolutions(ark_mem, dsmPtr);
  }
  if (retval < 0)  return(retval);
  if (retval > 0) {
    *nflagPtr = retval;
    return(TRY_AGAIN);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    ARKStep updated solution:\n");
    N_VPrint(ark_mem->ycur);
#endif

#ifdef SUNDIALS_DEBUG
  printf("    ARKStep error estimate = %"RSYM"\n", *dsmPtr);
#endif

  /* solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ARKStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkStep_TakeStep_Z", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}